

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O2

int __thiscall ncnn::ConvolutionDepthWise::create_pipeline(ConvolutionDepthWise *this,Option *opt)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  size_t sVar5;
  long lVar6;
  Mat weight_data_g;
  Mat int8_weight_data_g;
  Mat int8_weight_data;
  Mat local_c0;
  Option opt_q;
  
  iVar3 = 0;
  if (((opt->use_int8_inference == true) && ((this->weight_data).elemsize == 4)) &&
     (this->int8_scale_term != 0)) {
    Mat::Mat(&int8_weight_data,this->weight_data_size,1,(Allocator *)0x0);
    if ((int8_weight_data.data == (void *)0x0) ||
       ((long)int8_weight_data.c * int8_weight_data.cstep == 0)) {
      Mat::~Mat(&int8_weight_data);
      iVar3 = -100;
    }
    else {
      iVar3 = this->group;
      iVar2 = this->weight_data_size / iVar3;
      sVar5 = (size_t)iVar2;
      lVar4 = 0;
      for (lVar6 = 0; lVar6 < iVar3; lVar6 = lVar6 + 1) {
        opt_q.lightmode = opt->lightmode;
        opt_q._1_3_ = *(undefined3 *)&opt->field_0x1;
        opt_q.num_threads = opt->num_threads;
        opt_q.workspace_allocator = opt->workspace_allocator;
        opt_q.openmp_blocktime = opt->openmp_blocktime;
        opt_q.use_winograd_convolution = opt->use_winograd_convolution;
        opt_q.use_sgemm_convolution = opt->use_sgemm_convolution;
        opt_q.use_int8_inference = opt->use_int8_inference;
        opt_q.use_vulkan_compute = opt->use_vulkan_compute;
        uVar1._0_1_ = opt->use_bf16_storage;
        uVar1._1_1_ = opt->use_fp16_packed;
        uVar1._2_1_ = opt->use_fp16_storage;
        uVar1._3_1_ = opt->use_fp16_arithmetic;
        uVar1._4_1_ = opt->use_int8_packed;
        uVar1._5_1_ = opt->use_int8_storage;
        uVar1._6_1_ = opt->use_int8_arithmetic;
        uVar1._7_1_ = opt->use_packing_layout;
        opt_q.use_shader_pack8 = opt->use_shader_pack8;
        opt_q.use_subgroup_basic = opt->use_subgroup_basic;
        opt_q.use_subgroup_vote = opt->use_subgroup_vote;
        opt_q.use_subgroup_ballot = opt->use_subgroup_ballot;
        opt_q.use_subgroup_shuffle = opt->use_subgroup_shuffle;
        opt_q.use_image_storage = opt->use_image_storage;
        opt_q.use_tensor_storage = opt->use_tensor_storage;
        opt_q.use_weight_fp16_storage = opt->use_weight_fp16_storage;
        opt_q.flush_denormals = opt->flush_denormals;
        opt_q.use_local_pool_allocator = opt->use_local_pool_allocator;
        opt_q.use_reserved_1 = opt->use_reserved_1;
        opt_q.use_reserved_2 = opt->use_reserved_2;
        opt_q.use_reserved_3 = opt->use_reserved_3;
        opt_q.use_reserved_4 = opt->use_reserved_4;
        opt_q.use_reserved_5 = opt->use_reserved_5;
        opt_q.use_reserved_6 = opt->use_reserved_6;
        opt_q.use_reserved_7 = opt->use_reserved_7;
        opt_q.use_reserved_8 = opt->use_reserved_8;
        opt_q.use_reserved_9 = opt->use_reserved_9;
        opt_q.use_reserved_10 = opt->use_reserved_10;
        opt_q.use_reserved_11 = opt->use_reserved_11;
        opt_q.blob_allocator = int8_weight_data.allocator;
        opt_q._32_8_ = uVar1 & 0xffffffffffffff;
        weight_data_g.elemsize = (this->weight_data).elemsize;
        weight_data_g.data =
             (void *)(weight_data_g.elemsize * lVar4 + (long)(this->weight_data).data);
        weight_data_g.elempack = (this->weight_data).elempack;
        weight_data_g.allocator = (this->weight_data).allocator;
        weight_data_g.refcount = (int *)0x0;
        weight_data_g.dims = 1;
        weight_data_g.h = 1;
        weight_data_g.d = 1;
        int8_weight_data_g.data =
             (void *)(int8_weight_data.elemsize * lVar4 + (long)int8_weight_data.data);
        int8_weight_data_g.refcount = (int *)0x0;
        int8_weight_data_g.elemsize = int8_weight_data.elemsize;
        int8_weight_data_g.elempack = int8_weight_data.elempack;
        int8_weight_data_g.allocator = int8_weight_data.allocator;
        int8_weight_data_g.h = 1;
        int8_weight_data_g.d = 1;
        local_c0.elemsize = (this->weight_data_int8_scales).elemsize;
        local_c0.data =
             (void *)(local_c0.elemsize * lVar6 + (long)(this->weight_data_int8_scales).data);
        local_c0.elempack = (this->weight_data_int8_scales).elempack;
        local_c0.allocator = (this->weight_data_int8_scales).allocator;
        local_c0.refcount = (int *)0x0;
        local_c0.dims = 1;
        local_c0.w = 1;
        local_c0.h = 1;
        local_c0.d = 1;
        local_c0.cstep = 1;
        weight_data_g.w = iVar2;
        weight_data_g.c = weight_data_g.dims;
        weight_data_g.cstep = sVar5;
        int8_weight_data_g.dims = weight_data_g.dims;
        int8_weight_data_g.w = iVar2;
        int8_weight_data_g.c = weight_data_g.dims;
        int8_weight_data_g.cstep = sVar5;
        local_c0.c = weight_data_g.dims;
        quantize_to_int8(&weight_data_g,&int8_weight_data_g,&local_c0,&opt_q);
        Mat::~Mat(&local_c0);
        Mat::~Mat(&int8_weight_data_g);
        Mat::~Mat(&weight_data_g);
        iVar3 = this->group;
        lVar4 = lVar4 + sVar5;
      }
      Mat::operator=(&this->weight_data,&int8_weight_data);
      Mat::~Mat(&int8_weight_data);
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int ConvolutionDepthWise::create_pipeline(const Option& opt)
{
#if NCNN_INT8
    // runtime quantize the weight data
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)4u && int8_scale_term)
    {
        Mat int8_weight_data(weight_data_size, (size_t)1u);
        if (int8_weight_data.empty())
            return -100;

        const int weight_data_size_g = weight_data_size / group;

        for (int g = 0; g < group; g++)
        {
            Option opt_q = opt;
            opt_q.blob_allocator = int8_weight_data.allocator;
            opt_q.use_packing_layout = false;

            const Mat weight_data_g = weight_data.range(weight_data_size_g * g, weight_data_size_g);
            Mat int8_weight_data_g = int8_weight_data.range(weight_data_size_g * g, weight_data_size_g);
            const Mat weight_data_int8_scales_g = weight_data_int8_scales.range(g, 1);
            quantize_to_int8(weight_data_g, int8_weight_data_g, weight_data_int8_scales_g, opt_q);
        }

        weight_data = int8_weight_data;
    }
#endif // NCNN_INT8

    return 0;
}